

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles2::Stress::(anonymous_namespace)::BlendingCase::genFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_19;
  void *local_18;
  BlendingCase *this_local;
  
  local_18 = this;
  this_local = (BlendingCase *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "uniform mediump vec4 u_special;\nvoid main ()\n{\n\tgl_FragColor = u_special;\n}\n",
             &local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string BlendingCase::genFragmentSource (void) const
{
	return
		"uniform mediump vec4 u_special;\n"
		"void main ()\n"
		"{\n"
		"	gl_FragColor = u_special;\n"
		"}\n";
}